

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxchangebasis.hpp
# Opt level: O0

void __thiscall
soplex::
SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::addedRows(SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,int n)

{
  Representation RVar1;
  int iVar2;
  Status SVar3;
  int iVar4;
  SPxStatus SVar5;
  Status *pSVar6;
  SPxId *this_00;
  ostream *this_01;
  string *m;
  int in_ESI;
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  int i_1;
  int i;
  int in_stack_000000a4;
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_000000a8;
  undefined8 in_stack_ffffffffffffff78;
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffff80;
  allocator *this_02;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  Status in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffffb0;
  allocator local_41;
  string local_40 [36];
  int local_1c;
  DataKey local_18;
  int local_10;
  int local_c;
  
  if (in_ESI < 1) {
    return;
  }
  local_c = in_ESI;
  reDim(in_stack_ffffffffffffffb0);
  RVar1 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::rep(in_RDI->theLP);
  if (RVar1 == COLUMN) {
    local_10 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)0x50871a);
    for (local_10 = local_10 - local_c; iVar4 = local_10,
        iVar2 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)0x508738), iVar4 < iVar2; local_10 = local_10 + 1) {
      SVar3 = dualRowStatus(in_stack_000000a8,in_stack_000000a4);
      pSVar6 = Desc::rowStatus((Desc *)in_stack_ffffffffffffff80,
                               (int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
      *pSVar6 = SVar3;
      local_18 = (DataKey)SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ::rId((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                                (int)((ulong)in_stack_ffffffffffffff80 >> 0x20));
      this_00 = baseId(in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
      SPxId::operator=(this_00,(SPxRowId *)&local_18);
    }
  }
  else {
    local_1c = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)0x5087c4);
    local_1c = local_1c - local_c;
    while (in_stack_ffffffffffffff94 = local_1c,
          iVar4 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)0x5087e2), in_stack_ffffffffffffff94 < iVar4) {
      in_stack_ffffffffffffff90 = dualRowStatus(in_stack_000000a8,in_stack_000000a4);
      pSVar6 = Desc::rowStatus((Desc *)in_stack_ffffffffffffff80,
                               (int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
      *pSVar6 = in_stack_ffffffffffffff90;
      local_1c = local_1c + 1;
    }
  }
  SVar5 = status(in_RDI);
  if ((NO_PROBLEM < SVar5) && ((in_RDI->matrixIsSetup & 1U) != 0)) {
    loadMatrixVecs(in_RDI);
  }
  SVar5 = status(in_RDI);
  if ((uint)(SVar5 + PRIMAL) < 4) {
    return;
  }
  if (SVar5 == PRIMAL) {
LAB_00508894:
    setStatus((SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),SVar5);
  }
  else {
    if (SVar5 != OPTIMAL) {
      if (SVar5 == UNBOUNDED) goto LAB_00508894;
      if (SVar5 != INFEASIBLE) {
        this_01 = std::operator<<((ostream *)&std::cerr,"ECHBAS04 Unknown basis status!");
        std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
        m = (string *)__cxa_allocate_exception(0x28);
        this_02 = &local_41;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_40,"XCHBAS01 This should never happen.",this_02);
        SPxInternalCodeException::SPxInternalCodeException((SPxInternalCodeException *)this_02,m);
        __cxa_throw(m,&SPxInternalCodeException::typeinfo,
                    SPxInternalCodeException::~SPxInternalCodeException);
      }
    }
    setStatus((SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),SVar5);
  }
  return;
}

Assistant:

void SPxBasisBase<R>::addedRows(int n)
{
   assert(theLP != nullptr);

   if(n > 0)
   {
      reDim();

      if(theLP->rep() == SPxSolverBase<R>::COLUMN)
      {
         /* after adding rows in column representation, reDim() should set these bools to false. */
         assert(!matrixIsSetup && !factorized);

         for(int i = theLP->nRows() - n; i < theLP->nRows(); ++i)
         {
            thedesc.rowStatus(i) = dualRowStatus(i);
            baseId(i) = theLP->SPxLPBase<R>::rId(i);
         }
      }
      else
      {
         assert(theLP->rep() == SPxSolverBase<R>::ROW);

         for(int i = theLP->nRows() - n; i < theLP->nRows(); ++i)
            thedesc.rowStatus(i) = dualRowStatus(i);
      }

      /* If matrix was set up, load new basis vectors to the matrix.
       * In the row case, the basis is not effected by adding rows. However,
       * since @c matrix stores references to the rows in the LP (SPxLPBase<R>), a realloc
       * in SPxLPBase<R> (e.g. due to space requirements) might invalidate these references.
       * We therefore have to "reload" the matrix if it is set up. Note that reDim()
       * leaves @c matrixIsSetup untouched if only row have been added, since the basis
       * matrix already has the correct size. */
      if(status() > NO_PROBLEM && matrixIsSetup)
         loadMatrixVecs();

      /* update basis status */
      switch(status())
      {
      case PRIMAL:
      case UNBOUNDED:
         setStatus(REGULAR);
         break;

      case OPTIMAL:
      case INFEASIBLE:
         setStatus(DUAL);
         break;

      case NO_PROBLEM:
      case SINGULAR:
      case REGULAR:
      case DUAL:
         break;

      default:
         SPX_MSG_ERROR(std::cerr << "ECHBAS04 Unknown basis status!" << std::endl;)
         throw SPxInternalCodeException("XCHBAS01 This should never happen.");
      }
   }
}